

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

void __thiscall
boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
          (unbounded_array<double,_std::allocator<double>_> *this)

{
  if (this->size_ != 0) {
    operator_delete(this->data_,this->size_ << 3);
    return;
  }
  return;
}

Assistant:

BOOST_UBLAS_INLINE
        ~unbounded_array () {
            if (size_) {
                if (! detail::has_trivial_destructor<T>::value) {
                    // std::_Destroy (begin(), end(), alloc_);
                    const iterator i_end = end();
                    for (iterator i = begin (); i != i_end; ++i) {
                        iterator_destroy (i); 
                    }
                }
                alloc_.deallocate (data_, size_);
            }
        }